

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O1

int doremote(lua_State *L)

{
  int iVar1;
  lua_State *L_00;
  char *pcVar2;
  uint idx;
  uint uVar3;
  size_t lcode;
  size_t local_30;
  
  L_00 = getstate(L);
  pcVar2 = luaL_checklstring(L,2,&local_30);
  lua_settop(L_00,0);
  iVar1 = luaL_loadbufferx(L_00,pcVar2,local_30,pcVar2,(char *)0x0);
  if (iVar1 == 0) {
    iVar1 = lua_pcallk(L_00,0,-1,0,0,(lua_KFunction)0x0);
  }
  if (iVar1 == 0) {
    iVar1 = lua_type(L_00,1);
    if (iVar1 == -1) {
      idx = 0;
    }
    else {
      uVar3 = 0;
      do {
        idx = uVar3 + 1;
        pcVar2 = lua_tolstring(L_00,idx,(size_t *)0x0);
        lua_pushstring(L,pcVar2);
        iVar1 = lua_type(L_00,uVar3 + 2);
        uVar3 = idx;
      } while (iVar1 != -1);
    }
    lua_settop(L_00,~idx);
  }
  else {
    lua_pushnil(L);
    pcVar2 = lua_tolstring(L_00,-1,(size_t *)0x0);
    lua_pushstring(L,pcVar2);
    lua_pushinteger(L,(long)iVar1);
    idx = 3;
  }
  return idx;
}

Assistant:

static int doremote (lua_State *L) {
  lua_State *L1 = getstate(L);
  size_t lcode;
  const char *code = luaL_checklstring(L, 2, &lcode);
  int status;
  lua_settop(L1, 0);
  status = luaL_loadbuffer(L1, code, lcode, code);
  if (status == LUA_OK)
    status = lua_pcall(L1, 0, LUA_MULTRET, 0);
  if (status != LUA_OK) {
    lua_pushnil(L);
    lua_pushstring(L, lua_tostring(L1, -1));
    lua_pushinteger(L, status);
    return 3;
  }
  else {
    int i = 0;
    while (!lua_isnone(L1, ++i))
      lua_pushstring(L, lua_tostring(L1, i));
    lua_pop(L1, i-1);
    return i-1;
  }
}